

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void fmt::internal::report_unknown_type(char code,char *type)

{
  int iVar1;
  FormatError *pFVar2;
  char **in_R8;
  int local_8c;
  BasicCStringRef<char> local_88;
  string local_80;
  CStringRef local_60;
  undefined1 local_55;
  BasicCStringRef<char> local_48;
  string local_40;
  CStringRef local_20;
  char *local_18;
  char *type_local;
  char code_local;
  
  local_18 = type;
  type_local._7_1_ = code;
  iVar1 = isprint((uint)(byte)code);
  if (iVar1 != 0) {
    local_55 = 1;
    pFVar2 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_48,"unknown format code \'{}\' for {}");
    format<char,char_const*>
              (&local_40,(fmt *)local_48.data_,(char *)((long)&type_local + 7),(char *)&local_18,
               in_R8);
    BasicCStringRef<char>::BasicCStringRef<std::allocator<char>>(&local_20,&local_40);
    FormatError::FormatError(pFVar2,local_20);
    local_55 = 0;
    __cxa_throw(pFVar2,&FormatError::typeinfo,FormatError::~FormatError);
  }
  pFVar2 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_88,"unknown format code \'\\x{:02x}\' for {}");
  local_8c = (int)type_local._7_1_;
  format<unsigned_int,char_const*>
            (&local_80,(fmt *)local_88.data_,(CStringRef)&local_8c,(uint *)&local_18,in_R8);
  BasicCStringRef<char>::BasicCStringRef<std::allocator<char>>(&local_60,&local_80);
  FormatError::FormatError(pFVar2,local_60);
  __cxa_throw(pFVar2,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

FMT_FUNC void internal::report_unknown_type(char code, const char *type) {
  (void)type;
  if (std::isprint(static_cast<unsigned char>(code))) {
    FMT_THROW(FormatError(
        format("unknown format code '{}' for {}", code, type)));
  }
  FMT_THROW(FormatError(
      format("unknown format code '\\x{:02x}' for {}",
        static_cast<unsigned>(code), type)));
}